

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_eval.cc
# Opt level: O2

void EXPLORE_EVAL::finish(explore_eval *data)

{
  ostream *poVar1;
  
  if (data->all->quiet == false) {
    poVar1 = std::operator<<(&(data->all->trace_message).super_ostream,"update count = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    if (data->violations != 0) {
      poVar1 = std::operator<<(&(data->all->trace_message).super_ostream,"violation count = ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if (data->fixed_multiplier == false) {
      poVar1 = std::operator<<(&(data->all->trace_message).super_ostream,"final multiplier = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,data->multiplier);
      std::endl<char,std::char_traits<char>>(poVar1);
      return;
    }
  }
  return;
}

Assistant:

void finish(explore_eval& data)
{
  if (!data.all->quiet)
  {
    data.all->trace_message << "update count = " << data.update_count << endl;
    if (data.violations > 0)
      data.all->trace_message << "violation count = " << data.violations << endl;
    if (!data.fixed_multiplier)
      data.all->trace_message << "final multiplier = " << data.multiplier << endl;
  }
}